

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void load_buffer_8x8(int16_t *input,__m128i *in,int stride,int flipud,int fliplr,int shift)

{
  __m128i alVar1;
  __m128i alVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m128i alVar7;
  undefined1 auVar8 [16];
  __m128i alVar9;
  __m128i alVar10;
  __m128i alVar11;
  undefined1 auVar12 [16];
  __m128i alVar13;
  __m128i alVar14;
  undefined1 auVar15 [16];
  __m128i alVar16;
  undefined1 auVar17 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar18 [16];
  
  if (flipud == 0) {
    alVar11 = *(__m128i *)input;
    *in = alVar11;
    alVar2 = *(__m128i *)(input + stride);
    in[1] = alVar2;
    alVar7 = *(__m128i *)(input + stride * 2);
    in[2] = alVar7;
    alVar9 = *(__m128i *)(input + stride * 3);
    in[3] = alVar9;
    alVar10 = *(__m128i *)(input + stride * 4);
    in[4] = alVar10;
    alVar16 = *(__m128i *)(input + stride * 5);
    in[5] = alVar16;
    alVar1 = *(__m128i *)(input + stride * 6);
    in[6] = alVar1;
    input = input + stride * 7;
  }
  else {
    alVar11 = *(__m128i *)(input + stride * 7);
    *in = alVar11;
    alVar2 = *(__m128i *)(input + stride * 6);
    in[1] = alVar2;
    alVar7 = *(__m128i *)(input + stride * 5);
    in[2] = alVar7;
    alVar9 = *(__m128i *)(input + stride * 4);
    in[3] = alVar9;
    alVar10 = *(__m128i *)(input + stride * 3);
    in[4] = alVar10;
    alVar16 = *(__m128i *)(input + stride * 2);
    in[5] = alVar16;
    alVar1 = *(__m128i *)(input + stride);
    in[6] = alVar1;
  }
  auVar17 = *(undefined1 (*) [16])input;
  if (fliplr != 0) {
    alVar10 = (__m128i)pshufb((undefined1  [16])alVar10,_DAT_004c2d00);
    alVar16 = (__m128i)pshufb((undefined1  [16])alVar16,_DAT_004c2d00);
    alVar1 = (__m128i)pshufb((undefined1  [16])alVar1,_DAT_004c2d00);
    auVar17 = pshufb(auVar17,_DAT_004c2d00);
    alVar9 = (__m128i)pshufb((undefined1  [16])alVar9,_DAT_004c2d00);
    alVar7 = (__m128i)pshufb((undefined1  [16])alVar7,_DAT_004c2d00);
    alVar2 = (__m128i)pshufb((undefined1  [16])alVar2,_DAT_004c2d00);
    alVar11 = (__m128i)pshufb((undefined1  [16])alVar11,_DAT_004c2d00);
  }
  auVar18 = pmovsxwd(in_XMM9,(undefined1  [16])alVar11);
  *(int *)*in = auVar18._0_4_ << shift;
  *(int *)((long)*in + 4) = auVar18._4_4_;
  *(int *)(*in + 1) = auVar18._8_4_;
  *(int *)((long)*in + 0xc) = auVar18._12_4_;
  auVar12._8_4_ = (undefined4)alVar11[1];
  auVar12._12_4_ = alVar11[1]._4_4_;
  auVar12._0_8_ = alVar11[1];
  auVar18 = pmovsxwd(auVar12,auVar12);
  alVar13[0]._0_4_ = auVar18._0_4_ << shift;
  alVar13[0]._4_4_ = auVar18._4_4_;
  alVar13[1]._0_4_ = auVar18._8_4_;
  alVar13[1]._4_4_ = auVar18._12_4_;
  in[1] = alVar13;
  auVar18 = pmovsxwd((undefined1  [16])alVar13,(undefined1  [16])alVar2);
  alVar14[0]._0_4_ = auVar18._0_4_ << shift;
  alVar14[0]._4_4_ = auVar18._4_4_;
  alVar14[1]._0_4_ = auVar18._8_4_;
  alVar14[1]._4_4_ = auVar18._12_4_;
  in[2] = alVar14;
  auVar15 = pmovsxwd((undefined1  [16])alVar14,(undefined1  [16])alVar7);
  auVar3._8_4_ = (undefined4)alVar2[1];
  auVar3._12_4_ = alVar2[1]._4_4_;
  auVar3._0_8_ = alVar2[1];
  auVar18 = pmovsxwd(auVar3,auVar3);
  *(int *)in[3] = auVar18._0_4_ << shift;
  *(int *)((long)in[3] + 4) = auVar18._4_4_;
  *(int *)(in[3] + 1) = auVar18._8_4_;
  *(int *)((long)in[3] + 0xc) = auVar18._12_4_;
  *(int *)in[4] = auVar15._0_4_ << shift;
  *(int *)((long)in[4] + 4) = auVar15._4_4_;
  *(int *)(in[4] + 1) = auVar15._8_4_;
  *(int *)((long)in[4] + 0xc) = auVar15._12_4_;
  auVar4._0_8_ = alVar7[1];
  auVar4._8_4_ = (int)alVar7[1];
  auVar4._12_4_ = alVar7[1]._4_4_;
  auVar18 = pmovsxwd(auVar4,auVar4);
  alVar2[0]._0_4_ = auVar18._0_4_ << shift;
  alVar2[0]._4_4_ = auVar18._4_4_;
  alVar2[1]._0_4_ = auVar18._8_4_;
  alVar2[1]._4_4_ = auVar18._12_4_;
  in[5] = alVar2;
  auVar18 = pmovsxwd((undefined1  [16])alVar2,(undefined1  [16])alVar9);
  *(int *)in[6] = auVar18._0_4_ << shift;
  *(int *)((long)in[6] + 4) = auVar18._4_4_;
  *(int *)(in[6] + 1) = auVar18._8_4_;
  *(int *)((long)in[6] + 0xc) = auVar18._12_4_;
  auVar5._0_8_ = alVar9[1];
  auVar5._8_4_ = (int)alVar9[1];
  auVar5._12_4_ = alVar9[1]._4_4_;
  auVar18 = pmovsxwd(auVar5,auVar5);
  alVar7[0]._0_4_ = auVar18._0_4_ << shift;
  alVar7[0]._4_4_ = auVar18._4_4_;
  alVar7[1]._0_4_ = auVar18._8_4_;
  alVar7[1]._4_4_ = auVar18._12_4_;
  in[7] = alVar7;
  auVar18 = pmovsxwd((undefined1  [16])alVar7,(undefined1  [16])alVar10);
  *(int *)in[8] = auVar18._0_4_ << shift;
  *(int *)((long)in[8] + 4) = auVar18._4_4_;
  *(int *)(in[8] + 1) = auVar18._8_4_;
  *(int *)((long)in[8] + 0xc) = auVar18._12_4_;
  auVar6._0_8_ = alVar10[1];
  auVar6._8_4_ = (int)alVar10[1];
  auVar6._12_4_ = alVar10[1]._4_4_;
  auVar18 = pmovsxwd(auVar6,auVar6);
  alVar9[0]._0_4_ = auVar18._0_4_ << shift;
  alVar9[0]._4_4_ = auVar18._4_4_;
  alVar9[1]._0_4_ = auVar18._8_4_;
  alVar9[1]._4_4_ = auVar18._12_4_;
  in[9] = alVar9;
  auVar18 = pmovsxwd((undefined1  [16])alVar9,(undefined1  [16])alVar16);
  auVar8._0_8_ = alVar16[1];
  auVar8._8_4_ = (int)alVar16[1];
  auVar8._12_4_ = alVar16[1]._4_4_;
  auVar15 = pmovsxwd(auVar8,auVar8);
  alVar10[0]._0_4_ = auVar18._0_4_ << shift;
  alVar10[0]._4_4_ = auVar18._4_4_;
  alVar10[1]._0_4_ = auVar18._8_4_;
  alVar10[1]._4_4_ = auVar18._12_4_;
  in[10] = alVar10;
  auVar18 = pmovsxwd((undefined1  [16])alVar10,(undefined1  [16])alVar1);
  *(int *)in[0xb] = auVar15._0_4_ << shift;
  *(int *)((long)in[0xb] + 4) = auVar15._4_4_;
  *(int *)(in[0xb] + 1) = auVar15._8_4_;
  *(int *)((long)in[0xb] + 0xc) = auVar15._12_4_;
  *(int *)in[0xc] = auVar18._0_4_ << shift;
  *(int *)((long)in[0xc] + 4) = auVar18._4_4_;
  *(int *)(in[0xc] + 1) = auVar18._8_4_;
  *(int *)((long)in[0xc] + 0xc) = auVar18._12_4_;
  auVar18._8_4_ = (undefined4)alVar1[1];
  auVar18._12_4_ = alVar1[1]._4_4_;
  auVar18._0_8_ = alVar1[1];
  auVar18 = pmovsxwd(auVar18,auVar18);
  alVar11[0]._0_4_ = auVar18._0_4_ << shift;
  alVar11[0]._4_4_ = auVar18._4_4_;
  alVar11[1]._0_4_ = auVar18._8_4_;
  alVar11[1]._4_4_ = auVar18._12_4_;
  in[0xd] = alVar11;
  auVar18 = pmovsxwd((undefined1  [16])alVar11,auVar17);
  *(int *)in[0xe] = auVar18._0_4_ << shift;
  *(int *)((long)in[0xe] + 4) = auVar18._4_4_;
  *(int *)(in[0xe] + 1) = auVar18._8_4_;
  *(int *)((long)in[0xe] + 0xc) = auVar18._12_4_;
  auVar15._0_8_ = auVar17._8_8_;
  auVar15._8_4_ = auVar17._8_4_;
  auVar15._12_4_ = auVar17._12_4_;
  auVar17 = pmovsxwd(auVar15,auVar15);
  *(int *)in[0xf] = auVar17._0_4_ << shift;
  *(int *)((long)in[0xf] + 4) = auVar17._4_4_;
  *(int *)(in[0xf] + 1) = auVar17._8_4_;
  *(int *)((long)in[0xf] + 0xc) = auVar17._12_4_;
  return;
}

Assistant:

static inline void load_buffer_8x8(const int16_t *input, __m128i *in,
                                   int stride, int flipud, int fliplr,
                                   int shift) {
  __m128i u;
  if (!flipud) {
    in[0] = _mm_load_si128((const __m128i *)(input + 0 * stride));
    in[1] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    in[2] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    in[3] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    in[4] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    in[5] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    in[6] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    in[7] = _mm_load_si128((const __m128i *)(input + 7 * stride));
  } else {
    in[0] = _mm_load_si128((const __m128i *)(input + 7 * stride));
    in[1] = _mm_load_si128((const __m128i *)(input + 6 * stride));
    in[2] = _mm_load_si128((const __m128i *)(input + 5 * stride));
    in[3] = _mm_load_si128((const __m128i *)(input + 4 * stride));
    in[4] = _mm_load_si128((const __m128i *)(input + 3 * stride));
    in[5] = _mm_load_si128((const __m128i *)(input + 2 * stride));
    in[6] = _mm_load_si128((const __m128i *)(input + 1 * stride));
    in[7] = _mm_load_si128((const __m128i *)(input + 0 * stride));
  }

  if (fliplr) {
    in[0] = mm_reverse_epi16(in[0]);
    in[1] = mm_reverse_epi16(in[1]);
    in[2] = mm_reverse_epi16(in[2]);
    in[3] = mm_reverse_epi16(in[3]);
    in[4] = mm_reverse_epi16(in[4]);
    in[5] = mm_reverse_epi16(in[5]);
    in[6] = mm_reverse_epi16(in[6]);
    in[7] = mm_reverse_epi16(in[7]);
  }

  u = _mm_unpackhi_epi64(in[4], in[4]);
  in[8] = _mm_cvtepi16_epi32(in[4]);
  in[9] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[5], in[5]);
  in[10] = _mm_cvtepi16_epi32(in[5]);
  in[11] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[6], in[6]);
  in[12] = _mm_cvtepi16_epi32(in[6]);
  in[13] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[7], in[7]);
  in[14] = _mm_cvtepi16_epi32(in[7]);
  in[15] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[3], in[3]);
  in[6] = _mm_cvtepi16_epi32(in[3]);
  in[7] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[2], in[2]);
  in[4] = _mm_cvtepi16_epi32(in[2]);
  in[5] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[1], in[1]);
  in[2] = _mm_cvtepi16_epi32(in[1]);
  in[3] = _mm_cvtepi16_epi32(u);

  u = _mm_unpackhi_epi64(in[0], in[0]);
  in[0] = _mm_cvtepi16_epi32(in[0]);
  in[1] = _mm_cvtepi16_epi32(u);

  in[0] = _mm_slli_epi32(in[0], shift);
  in[1] = _mm_slli_epi32(in[1], shift);
  in[2] = _mm_slli_epi32(in[2], shift);
  in[3] = _mm_slli_epi32(in[3], shift);
  in[4] = _mm_slli_epi32(in[4], shift);
  in[5] = _mm_slli_epi32(in[5], shift);
  in[6] = _mm_slli_epi32(in[6], shift);
  in[7] = _mm_slli_epi32(in[7], shift);

  in[8] = _mm_slli_epi32(in[8], shift);
  in[9] = _mm_slli_epi32(in[9], shift);
  in[10] = _mm_slli_epi32(in[10], shift);
  in[11] = _mm_slli_epi32(in[11], shift);
  in[12] = _mm_slli_epi32(in[12], shift);
  in[13] = _mm_slli_epi32(in[13], shift);
  in[14] = _mm_slli_epi32(in[14], shift);
  in[15] = _mm_slli_epi32(in[15], shift);
}